

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O0

int messagereceiver_send_message_disposition
              (MESSAGE_RECEIVER_HANDLE message_receiver,char *link_name,
              delivery_number message_number,AMQP_VALUE delivery_state)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  char *my_name;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_VALUE pAStack_28;
  int result;
  AMQP_VALUE delivery_state_local;
  char *pcStack_18;
  delivery_number message_number_local;
  char *link_name_local;
  MESSAGE_RECEIVER_HANDLE message_receiver_local;
  
  pAStack_28 = delivery_state;
  delivery_state_local._4_4_ = message_number;
  pcStack_18 = link_name;
  link_name_local = (char *)message_receiver;
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
             ,"messagereceiver_send_message_disposition",0x1e0,1,"NULL message_receiver");
    }
    l._4_4_ = 0x1e1;
  }
  else if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN) {
    iVar1 = link_get_name(message_receiver->link,(char **)&l_2);
    if (iVar1 == 0) {
      iVar1 = strcmp(pcStack_18,(char *)l_2);
      if (iVar1 == 0) {
        iVar1 = link_send_disposition
                          (*(LINK_HANDLE *)link_name_local,delivery_state_local._4_4_,pAStack_28);
        if (iVar1 == 0) {
          l._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                      ,"messagereceiver_send_message_disposition",0x1fd,1,
                      "Seding disposition failed");
          }
          l._4_4_ = 0x1fe;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                    ,"messagereceiver_send_message_disposition",0x1f6,1,"Link name does not match");
        }
        l._4_4_ = 0x1f7;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                  ,"messagereceiver_send_message_disposition",0x1ef,1,"Failed getting link name");
      }
      l._4_4_ = 0x1f0;
    }
  }
  else {
    my_name = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)my_name != (LOGGER_LOG)0x0) {
      (*(code *)my_name)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                         ,"messagereceiver_send_message_disposition",0x1e7,1,
                         "Message received not open");
    }
    l._4_4_ = 0x1e8;
  }
  return l._4_4_;
}

Assistant:

int messagereceiver_send_message_disposition(MESSAGE_RECEIVER_HANDLE message_receiver, const char* link_name, delivery_number message_number, AMQP_VALUE delivery_state)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_OPEN)
        {
            LogError("Message received not open");
            result = MU_FAILURE;
        }
        else
        {
            const char* my_name;
            if (link_get_name(message_receiver->link, &my_name) != 0)
            {
                LogError("Failed getting link name");
                result = MU_FAILURE;
            }
            else
            {
                if (strcmp(link_name, my_name) != 0)
                {
                    LogError("Link name does not match");
                    result = MU_FAILURE;
                }
                else
                {
                    if (link_send_disposition(message_receiver->link, message_number, delivery_state) != 0)
                    {
                        LogError("Seding disposition failed");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}